

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::IndianCalendar::handleGetMonthLength(IndianCalendar *this,int32_t eyear,int32_t month)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t local_20;
  int local_1c;
  int32_t month_local;
  int32_t eyear_local;
  IndianCalendar *this_local;
  
  local_20 = month;
  local_1c = eyear;
  _month_local = this;
  if ((month < 0) || (0xb < month)) {
    iVar2 = ClockMath::floorDivide((double)month,0xc,&local_20);
    local_1c = iVar2 + local_1c;
  }
  UVar1 = isGregorianLeap(local_1c + 0x4e);
  if ((UVar1 == '\0') || (local_20 != 0)) {
    if ((local_20 < 1) || (5 < local_20)) {
      this_local._4_4_ = 0x1e;
    }
    else {
      this_local._4_4_ = 0x1f;
    }
  }
  else {
    this_local._4_4_ = 0x1f;
  }
  return this_local._4_4_;
}

Assistant:

int32_t IndianCalendar::handleGetMonthLength(int32_t eyear, int32_t month) const {
   if (month < 0 || month > 11) {
      eyear += ClockMath::floorDivide(month, 12, month);
   }

   if (isGregorianLeap(eyear + INDIAN_ERA_START) && month == 0) {
       return 31;
   }

   if (month >= 1 && month <= 5) {
       return 31;
   }

   return 30;
}